

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::t_formatter<spdlog::details::scoped_padder>::format
          (t_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  scoped_padder p;
  uint field_size;
  scoped_padder *in_stack_ffffffffffffffa0;
  memory_buf_t *in_stack_ffffffffffffffa8;
  padding_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  scoped_padder *in_stack_ffffffffffffffc0;
  memory_buf_t *in_stack_ffffffffffffffc8;
  unsigned_long in_stack_ffffffffffffffd0;
  
  fmt_helper::count_digits<unsigned_long>(0x1ef0df);
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  fmt_helper::append_int<unsigned_long>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  scoped_padder::~scoped_padder(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = fmt_helper::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }